

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O1

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_Near_Test::Body
          (iu_SyntaxTest_x_iutest_x_Near_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int x;
  AssertionResult iutest_ar;
  int *in_stack_fffffffffffffdf0;
  allocator<char> local_205;
  int local_204;
  AssertionResult local_200;
  AssertionHelper local_1d8;
  undefined1 local_1a8 [392];
  
  local_204 = 1;
  local_1a8._0_4_ = 0;
  local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 2;
  iutest::internal::CmpHelperNear<int,int>
            (&local_200,(internal *)0x3369df,"x","2",local_1a8,&local_204,(int *)&local_1d8,
             in_stack_fffffffffffffdf0);
  bVar2 = local_200.m_result;
  if (local_200.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = local_204;
    iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,(int *)&local_1d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d8,local_200.m_message._M_dataplus._M_p,&local_205);
    local_1d8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
    ;
    local_1d8.m_part_result.super_iuCodeMessage.m_line = 0x118;
    local_1d8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1d8,(Fixed *)local_1a8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (int)local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        &local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (int)local_1d8.m_part_result.super_iuCodeMessage.m_message.
                                    _M_dataplus._M_p),
                      local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200.m_message._M_dataplus._M_p != &local_200.m_message.field_2) {
    operator_delete(local_200.m_message._M_dataplus._M_p,
                    local_200.m_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar2 != false) {
    local_204 = 1;
    local_1a8._0_4_ = 0;
    local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 2;
    iutest::internal::CmpHelperNear<int,int>
              (&local_200,(internal *)0x3369df,"x","2",local_1a8,&local_204,(int *)&local_1d8,
               in_stack_fffffffffffffdf0);
    if (local_200.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = local_204;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,(int *)&local_1d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,local_200.m_message._M_dataplus._M_p,&local_205);
      local_1d8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_1d8.m_part_result.super_iuCodeMessage.m_line = 0x11a;
      local_1d8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1d8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      (int)local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p)
          != &local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 (int)local_1d8.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p),
                        local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    paVar1 = &local_200.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_200.m_message._M_dataplus._M_p,
                      local_200.m_message.field_2._M_allocated_capacity + 1);
    }
    local_204 = 1;
    local_1a8._0_4_ = 0;
    local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 2;
    iutest::internal::CmpHelperNear<int,int>
              (&local_200,(internal *)0x3369df,"x","2",local_1a8,&local_204,(int *)&local_1d8,
               in_stack_fffffffffffffdf0);
    if (local_200.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = local_204;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,(int *)&local_1d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,local_200.m_message._M_dataplus._M_p,&local_205);
      local_1d8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_1d8.m_part_result.super_iuCodeMessage.m_line = 0x11c;
      local_1d8.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
      iutest::AssertionHelper::OnFixed(&local_1d8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      (int)local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p)
          != &local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 (int)local_1d8.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p),
                        local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_200.m_message._M_dataplus._M_p,
                      local_200.m_message.field_2._M_allocated_capacity + 1);
    }
    local_204 = 1;
    local_1a8._0_4_ = 0;
    local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 2;
    iutest::internal::CmpHelperNear<int,int>
              (&local_200,(internal *)0x3369df,"x","2",local_1a8,&local_204,(int *)&local_1d8,
               in_stack_fffffffffffffdf0);
    if (local_200.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = local_204;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a8,(int *)&local_1d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d8,local_200.m_message._M_dataplus._M_p,&local_205);
      local_1d8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_1d8.m_part_result.super_iuCodeMessage.m_line = 0x11e;
      local_1d8.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
      iutest::AssertionHelper::OnFixed(&local_1d8,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      (int)local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p)
          != &local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1d8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 (int)local_1d8.m_part_result.super_iuCodeMessage.m_message.
                                      _M_dataplus._M_p),
                        local_1d8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_200.m_message._M_dataplus._M_p,
                      local_200.m_message.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

IUTEST(SyntaxTest, Near)
{
    if( int x = 1 )
        IUTEST_ASSERT_NEAR(0, x, 2) << x;
    if( int x = 1 )
        IUTEST_EXPECT_NEAR(0, x, 2) << x;
    if( int x = 1 )
        IUTEST_INFORM_NEAR(0, x, 2) << x;
    if( int x = 1 )
        IUTEST_ASSUME_NEAR(0, x, 2) << x;
}